

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTMath.cpp
# Opt level: O0

void __thiscall RTVector3::accelToQuaternion(RTVector3 *this,RTQuaternion *qPose)

{
  RTFLOAT RVar1;
  undefined4 extraout_XMM0_Db;
  double dVar2;
  RTFLOAT local_40;
  undefined1 local_3c [4];
  RTFLOAT angle;
  RTVector3 z;
  RTVector3 vec;
  RTVector3 normAccel;
  RTQuaternion *qPose_local;
  RTVector3 *this_local;
  
  vec.m_data._4_8_ = *(undefined8 *)this->m_data;
  RTVector3((RTVector3 *)(z.m_data + 1));
  RTVector3((RTVector3 *)local_3c,0.0,0.0,1.0);
  normalize((RTVector3 *)(vec.m_data + 1));
  RVar1 = dotProduct((RTVector3 *)local_3c,(RTVector3 *)(vec.m_data + 1));
  dVar2 = std::acos((double)CONCAT44(extraout_XMM0_Db,RVar1));
  local_40 = SUB84(dVar2,0);
  crossProduct((RTVector3 *)(vec.m_data + 1),(RTVector3 *)local_3c,(RTVector3 *)(z.m_data + 1));
  normalize((RTVector3 *)(z.m_data + 1));
  RTQuaternion::fromAngleVector(qPose,&local_40,(RTVector3 *)(z.m_data + 1));
  return;
}

Assistant:

void RTVector3::accelToQuaternion(RTQuaternion& qPose) const
{
    RTVector3 normAccel = *this;
    RTVector3 vec;
    RTVector3 z(0, 0, 1.0);

    normAccel.normalize();

    RTFLOAT angle = acos(RTVector3::dotProduct(z, normAccel));
    RTVector3::crossProduct(normAccel, z, vec);
    vec.normalize();

    qPose.fromAngleVector(angle, vec);
}